

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_xattr.c
# Opt level: O1

void archive_entry_xattr_add_entry(archive_entry *entry,char *name,void *value,size_t size)

{
  ae_xattr *paVar1;
  char *pcVar2;
  void *__dest;
  
  paVar1 = (ae_xattr *)malloc(0x20);
  if (paVar1 != (ae_xattr *)0x0) {
    pcVar2 = strdup(name);
    paVar1->name = pcVar2;
    if (pcVar2 != (char *)0x0) {
      __dest = malloc(size);
      paVar1->value = __dest;
      if (__dest == (void *)0x0) {
        size = 0;
      }
      else {
        memcpy(__dest,value,size);
      }
      paVar1->size = size;
      paVar1->next = entry->xattr_head;
      entry->xattr_head = paVar1;
      return;
    }
  }
  __archive_errx(1,"Out of memory");
}

Assistant:

void
archive_entry_xattr_add_entry(struct archive_entry *entry,
	const char *name, const void *value, size_t size)
{
	struct ae_xattr	*xp;

	if ((xp = (struct ae_xattr *)malloc(sizeof(struct ae_xattr))) == NULL)
		__archive_errx(1, "Out of memory");

	if ((xp->name = strdup(name)) == NULL)
		__archive_errx(1, "Out of memory");

	if ((xp->value = malloc(size)) != NULL) {
		memcpy(xp->value, value, size);
		xp->size = size;
	} else
		xp->size = 0;

	xp->next = entry->xattr_head;
	entry->xattr_head = xp;
}